

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_macro_function.cpp
# Opt level: O1

unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> __thiscall
duckdb::TableMacroFunction::Deserialize(TableMacroFunction *this,Deserializer *deserializer)

{
  int iVar1;
  _Head_base<0UL,_duckdb::TableMacroFunction_*,_false> this_00;
  pointer pTVar2;
  pointer *__ptr;
  byte bVar3;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var4;
  unique_ptr<duckdb::TableMacroFunction,_std::default_delete<duckdb::TableMacroFunction>,_true>
  result;
  _Tuple_impl<0UL,_duckdb::TableMacroFunction_*,_std::default_delete<duckdb::TableMacroFunction>_>
  local_38;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_30;
  
  this_00._M_head_impl = (TableMacroFunction *)operator_new(0x68);
  TableMacroFunction(this_00._M_head_impl);
  local_38.super__Head_base<0UL,_duckdb::TableMacroFunction_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::TableMacroFunction_*,_false>)
       (_Head_base<0UL,_duckdb::TableMacroFunction_*,_false>)this_00._M_head_impl;
  pTVar2 = unique_ptr<duckdb::TableMacroFunction,_std::default_delete<duckdb::TableMacroFunction>,_true>
           ::operator->((unique_ptr<duckdb::TableMacroFunction,_std::default_delete<duckdb::TableMacroFunction>,_true>
                         *)&local_38);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"query_node");
  bVar3 = (byte)iVar1;
  if (bVar3 == 0) {
    _Var4._M_head_impl =
         (pTVar2->query_node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pTVar2->query_node).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    if (_Var4._M_head_impl == (QueryNode *)0x0) {
      bVar3 = 0;
      goto LAB_005c5e7a;
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      local_30._M_head_impl = (QueryNode *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      QueryNode::Deserialize((QueryNode *)&stack0xffffffffffffffd0,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var4._M_head_impl =
         (pTVar2->query_node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pTVar2->query_node).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = local_30._M_head_impl;
    if (_Var4._M_head_impl == (QueryNode *)0x0) {
      bVar3 = 1;
      goto LAB_005c5e7a;
    }
  }
  (*(_Var4._M_head_impl)->_vptr_QueryNode[1])();
LAB_005c5e7a:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar3);
  (this->super_MacroFunction)._vptr_MacroFunction =
       (_func_int **)
       local_38.super__Head_base<0UL,_duckdb::TableMacroFunction_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>_>)
         (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>_>)this;
}

Assistant:

unique_ptr<MacroFunction> TableMacroFunction::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<TableMacroFunction>(new TableMacroFunction());
	deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(200, "query_node", result->query_node);
	return std::move(result);
}